

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O1

MatrixXd * __thiscall
mnf::Manifold::diffRetractation(MatrixXd *__return_storage_ptr__,Manifold *this,ConstRefVec *x)

{
  undefined8 uVar1;
  
  if (((this->super_ValidManifold).flag_ == 0x677d7257) &&
     ((x->
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ).
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_rows.m_value == this->representationDim_)) {
    (*this->_vptr_Manifold[0x16])();
    return __return_storage_ptr__;
  }
  uVar1 = __cxa_allocate_exception(1);
  __cxa_throw(uVar1,&mnf_exception::typeinfo,0);
}

Assistant:

Manifold::~Manifold() {}